

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O0

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix8<256l>
          (fft<float,2048l,(re::fft::direction)1> *this,span<std::complex<float>,_256L> out)

{
  reference peVar1;
  reference peVar2;
  complex<float> cVar3;
  complex<float> cVar4;
  _ComplexT extraout_XMM0_Qa;
  _ComplexT extraout_XMM0_Qa_00;
  _ComplexT extraout_XMM0_Qa_01;
  _ComplexT extraout_XMM0_Qa_02;
  _ComplexT extraout_XMM0_Qa_03;
  _ComplexT extraout_XMM0_Qa_04;
  _ComplexT extraout_XMM0_Qa_05;
  _ComplexT extraout_XMM0_Qa_06;
  _ComplexT extraout_XMM0_Qa_07;
  _ComplexT extraout_XMM0_Qa_08;
  _ComplexT extraout_XMM0_Qa_09;
  _ComplexT extraout_XMM0_Qa_10;
  _ComplexT extraout_XMM0_Qa_11;
  int local_2c;
  int i;
  int_t s;
  int_t m;
  fft<float,_2048L,_(re::fft::direction)1> *this_local;
  span<std::complex<float>,_256L> out_local;
  
  this_local = (fft<float,_2048L,_(re::fft::direction)1> *)out.storage_.data_;
  for (local_2c = 1; local_2c < 0x20; local_2c = local_2c + 1) {
    if (0 < local_2c) {
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x20);
      cVar3._M_value = (long)(local_2c << 2) << 3;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                         ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x20);
      peVar1->_M_value = extraout_XMM0_Qa;
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x40);
      cVar3._M_value = (long)(local_2c * 2) << 3;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                         ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x40);
      peVar1->_M_value = extraout_XMM0_Qa_00;
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x60);
      cVar3._M_value = (long)(local_2c * 6) << 3;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                         ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x60);
      peVar1->_M_value = extraout_XMM0_Qa_01;
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x80);
      cVar3._M_value = (long)local_2c << 3;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                         ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x80);
      peVar1->_M_value = extraout_XMM0_Qa_02;
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xa0);
      cVar3._M_value = (long)(local_2c * 5) << 3;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                         ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xa0);
      peVar1->_M_value = extraout_XMM0_Qa_03;
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xc0);
      cVar3._M_value = (long)(local_2c * 3) << 3;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                         ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xc0);
      peVar1->_M_value = extraout_XMM0_Qa_04;
      gsl::span<std::complex<float>,_256L>::operator[]
                ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
      cVar3._M_value = (long)(local_2c * 7) << 3;
      cVar4._M_value = (_ComplexT)this;
      std::array<std::complex<float>,_1024UL>::operator[]
                ((array<std::complex<float>,_1024UL> *)this,cVar3._M_value);
      multiply_fast<float>(cVar4,cVar3);
      peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                         ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
      peVar1->_M_value = extraout_XMM0_Qa_05;
    }
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x20);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x40);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x60);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x80);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xa0);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xc0);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    scissors<float>(peVar1,peVar2);
    cVar4._M_value = (_ComplexT)&this_local;
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x60);
    flip<(re::fft::direction)1,float>(cVar4);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x60);
    peVar1->_M_value = extraout_XMM0_Qa_06;
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xa0);
    cVar3._M_value = 0x20;
    cVar4._M_value = (_ComplexT)this;
    std::array<std::complex<float>,_1024UL>::operator[]
              ((array<std::complex<float>,_1024UL> *)this,0x20);
    multiply_fast<float>(cVar4,cVar3);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xa0);
    peVar1->_M_value = extraout_XMM0_Qa_07;
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    cVar4._M_value = 0x20;
    cVar3._M_value = (_ComplexT)this;
    std::array<std::complex<float>,_1024UL>::operator[]
              ((array<std::complex<float>,_1024UL> *)this,0x20);
    multiply_fast<float>(cVar3,cVar4);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    peVar1->_M_value = extraout_XMM0_Qa_08;
    cVar4._M_value = (_ComplexT)&this_local;
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    flip<(re::fft::direction)1,float>(cVar4);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    peVar1->_M_value = extraout_XMM0_Qa_09;
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x40);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x20);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x60);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x80);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xc0);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xa0);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    scissors<float>(peVar1,peVar2);
    cVar4._M_value = (_ComplexT)&this_local;
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xc0);
    flip<(re::fft::direction)1,float>(cVar4);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xc0);
    peVar1->_M_value = extraout_XMM0_Qa_10;
    cVar4._M_value = (_ComplexT)&this_local;
    gsl::span<std::complex<float>,_256L>::operator[]
              ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    flip<(re::fft::direction)1,float>(cVar4);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    peVar1->_M_value = extraout_XMM0_Qa_11;
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x80);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x20);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xa0);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x40);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xc0);
    scissors<float>(peVar1,peVar2);
    peVar1 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0x60);
    peVar2 = gsl::span<std::complex<float>,_256L>::operator[]
                       ((span<std::complex<float>,_256L> *)&this_local,(long)local_2c + 0xe0);
    scissors<float>(peVar1,peVar2);
  }
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }